

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_square>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  long lVar4;
  int iVar5;
  long *in_RDI;
  undefined1 auVar6 [64];
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_square op;
  Mat *m;
  float fStack_3e4;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  int local_37c;
  undefined1 (*local_330) [64];
  int local_328;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float local_60;
  float fStack_5c;
  float fStack_58;
  
  lVar4 = in_RDI[7];
  iVar5 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
          (int)in_RDI[3];
  for (local_328 = 0; local_328 < (int)lVar4; local_328 = local_328 + 1) {
    local_330 = (undefined1 (*) [64])(*in_RDI + in_RDI[8] * (long)local_328 * in_RDI[2]);
    for (local_37c = 0; local_37c + 0xf < iVar5; local_37c = local_37c + 0x10) {
      auVar6 = vmulps_avx512f(*local_330,*local_330);
      *local_330 = auVar6;
      local_330 = local_330 + 1;
    }
    for (; local_37c + 7 < iVar5; local_37c = local_37c + 8) {
      auVar3 = *(undefined1 (*) [12])*local_330;
      fStack_3d4 = (float)((ulong)*(undefined8 *)(*local_330 + 8) >> 0x20);
      fStack_3d0 = (float)*(undefined8 *)(*local_330 + 0x10);
      fStack_3cc = (float)((ulong)*(undefined8 *)(*local_330 + 0x10) >> 0x20);
      fStack_3c8 = (float)*(undefined8 *)(*local_330 + 0x18);
      uStack_3c4 = (undefined4)((ulong)*(undefined8 *)(*local_330 + 0x18) >> 0x20);
      local_a0 = auVar3._0_4_;
      fStack_9c = auVar3._4_4_;
      fStack_98 = auVar3._8_4_;
      local_c0 = (float)*(undefined8 *)*local_330;
      fStack_bc = (float)((ulong)*(undefined8 *)*local_330 >> 0x20);
      fStack_b8 = (float)*(undefined8 *)(*local_330 + 8);
      auVar1._4_4_ = fStack_9c * fStack_bc;
      auVar1._0_4_ = local_a0 * local_c0;
      auVar1._12_4_ = fStack_3d4 * fStack_3d4;
      auVar1._8_4_ = fStack_98 * fStack_b8;
      auVar1._20_4_ = fStack_3cc * fStack_3cc;
      auVar1._16_4_ = fStack_3d0 * fStack_3d0;
      auVar1._28_4_ = uStack_3c4;
      auVar1._24_4_ = fStack_3c8 * fStack_3c8;
      *(undefined1 (*) [32])*local_330 = auVar1;
      local_330 = (undefined1 (*) [64])(*local_330 + 0x20);
    }
    for (; local_37c + 3 < iVar5; local_37c = local_37c + 4) {
      auVar3 = *(undefined1 (*) [12])*local_330;
      fStack_3e4 = (float)((ulong)*(undefined8 *)(*local_330 + 8) >> 0x20);
      local_60 = auVar3._0_4_;
      fStack_5c = auVar3._4_4_;
      fStack_58 = auVar3._8_4_;
      local_70 = (float)*(undefined8 *)*local_330;
      fStack_6c = (float)((ulong)*(undefined8 *)*local_330 >> 0x20);
      fStack_68 = (float)*(undefined8 *)(*local_330 + 8);
      auVar2._4_4_ = fStack_5c * fStack_6c;
      auVar2._0_4_ = local_60 * local_70;
      auVar2._12_4_ = fStack_3e4 * fStack_3e4;
      auVar2._8_4_ = fStack_58 * fStack_68;
      *(undefined1 (*) [16])*local_330 = auVar2;
      local_330 = (undefined1 (*) [64])(*local_330 + 0x10);
    }
    for (; local_37c < iVar5; local_37c = local_37c + 1) {
      *(float *)*local_330 = *(float *)*local_330 * *(float *)*local_330;
      local_330 = (undefined1 (*) [64])(*local_330 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}